

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O0

void Cba_NtkCleanMap2(Cba_Ntk_t *p)

{
  Cba_Ntk_t *p_local;
  
  Cba_ManCleanMap2(p->pDesign);
  return;
}

Assistant:

static inline void Cba_NtkCleanMap2( Cba_Ntk_t * p )               { Cba_ManCleanMap2(p->pDesign);         }